

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

ssize_t zt_cstr_rupto(char *s,ssize_t i,ssize_t j,char *set)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ssize_t sVar6;
  
  sVar1 = strlen(s);
  if (sVar1 == 0) {
    lVar5 = 0;
    lVar4 = 0;
  }
  else {
    lVar3 = (i >> 0x3f & sVar1) + i;
    if ((long)sVar1 <= lVar3) {
      lVar3 = sVar1 - 1;
    }
    lVar4 = (j >> 0x3f & sVar1) + j;
    if ((long)sVar1 <= lVar4) {
      lVar4 = sVar1 - 1;
    }
    lVar5 = lVar4;
    if (lVar4 < lVar3) {
      lVar5 = lVar3;
    }
    if (lVar3 < lVar4) {
      lVar4 = lVar3;
    }
  }
  while ((sVar6 = -1, lVar4 <= lVar5 &&
         (pcVar2 = strchr(set,(int)s[lVar5]), sVar6 = lVar5, pcVar2 == (char *)0x0))) {
    lVar5 = lVar5 + -1;
  }
  return sVar6;
}

Assistant:

ssize_t
zt_cstr_rupto(const char *s, ssize_t i, ssize_t j, const char *set) {
    zt_assert(set);

    CONVERT(s, i, j);
    for (; j >= i; j--) {
        if (strchr(set, s[j])) {
            return j;
        }
    }

    return -1;
}